

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

ssize_t __thiscall ktx::OutputStream::write(OutputStream *this,int __fd,void *__buf,size_t __n)

{
  void *pvVar1;
  FILE *__s;
  undefined4 in_register_00000034;
  string_view filepath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  __s = (FILE *)this->file;
  pvVar1 = (void *)fwrite((void *)CONCAT44(in_register_00000034,__fd),1,(size_t)__buf,__s);
  if (pvVar1 != __buf) {
    filepath._M_str = (char *)__s;
    filepath._M_len = (size_t)(this->filepath)._M_dataplus._M_p;
    fmtOutFile_abi_cxx11_(&local_38,(ktx *)(this->filepath)._M_string_length,filepath);
    errnoMessage_abi_cxx11_();
    Reporter::fatal<char_const(&)[38],std::__cxx11::string,std::__cxx11::string>
              ((Reporter *)__n,IO_FAILURE,(char (*) [38])"Failed to write output file \"{}\": {}.",
               &local_38,&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    pvVar1 = (void *)std::__cxx11::string::~string((string *)&local_38);
  }
  return (ssize_t)pvVar1;
}

Assistant:

void OutputStream::write(const char* data, std::size_t size, Reporter& report) {
    const auto written = std::fwrite(data, 1, size, file);
    if (written != size)
        report.fatal(rc::IO_FAILURE, "Failed to write output file \"{}\": {}.", fmtOutFile(filepath), errnoMessage());
}